

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,longdouble kappa,
          longdouble delta)

{
  int iVar1;
  bit_array *pbVar2;
  longdouble *args_2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  bool bVar7;
  long lVar8;
  int variable;
  long lVar9;
  long lVar10;
  ulong uVar11;
  longdouble *args_3;
  uint uVar12;
  ulong uVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar15;
  longdouble lVar16;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  uint local_68;
  int local_64;
  longdouble local_60;
  int local_54;
  long local_50;
  longdouble local_3c;
  
  local_50 = (long)k * 0x10;
  local_3c = *(longdouble *)(*(long *)(this + 0x78) + local_50);
  args_3 = (longdouble *)(*(long *)(this + 0x78) + local_50);
  local_60 = kappa / ((longdouble)1 - kappa) + delta;
  variable = (int)x;
  local_68 = r_size;
  local_64 = selected;
  local_54 = k;
  if (selected < 0) {
    args_2 = *(longdouble **)(this + 0x60);
    *args_3 = *args_2 * (longdouble)0.5 + local_3c;
    fmt_00._M_str = "    selected: {}/{} ({})/2 = pi {}\n";
    fmt_00._M_len = 0x23;
    lVar15 = in_ST3;
    lVar16 = in_ST3;
    debug_logger<true>::log<int,int,long_double,long_double>
              ((debug_logger<true> *)this,fmt_00,&local_64,(int *)&local_68,args_2,args_3);
    if (local_68 != 0) {
      lVar10 = 0x10;
      uVar11 = 0;
      do {
        iVar1 = *(int *)(*(long *)(this + 0x60) + lVar10);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar1].column);
        pbVar2 = *(bit_array **)(this + 0x50);
        *(longdouble *)&pbVar2[it[iVar1].value].super_bit_array_impl =
             *(longdouble *)&pbVar2[it[iVar1].value].super_bit_array_impl - local_60;
        lVar14 = lVar16;
        solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
        ::local_compute_reduced_cost<baryonyx::bit_array>
                  ((longdouble *)this,
                   (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                    *)(ulong)(uint)it[iVar1].column,variable,pbVar2);
        if (in_ST0 <= (longdouble)0) {
          lVar9 = (long)it[iVar1].value * 0x10;
          *(longdouble *)(*(long *)(this + 0x50) + lVar9) =
               (*(longdouble *)(*(long *)(this + 0x50) + lVar9) + in_ST0) - local_60;
        }
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x20;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = lVar15;
        lVar15 = lVar16;
        lVar16 = lVar14;
      } while (uVar11 != local_68);
    }
  }
  else {
    uVar11 = (ulong)(uint)selected;
    lVar10 = *(long *)(this + 0x60);
    lVar15 = *(longdouble *)(lVar10 + uVar11 * 0x20);
    if ((int)(selected + 1U) < r_size) {
      lVar9 = (ulong)(selected + 1U) * 0x20;
      *args_3 = (*(longdouble *)(lVar10 + lVar9) + lVar15) * (longdouble)0.5 + local_3c;
      fmt._M_str = "    selected: {}/{} ({}x{})/2 = pi {}\n";
      fmt._M_len = 0x26;
      lVar15 = in_ST3;
      lVar16 = in_ST3;
      debug_logger<true>::log<int,int,long_double,long_double,long_double>
                ((debug_logger<true> *)this,fmt,&local_64,(int *)&local_68,
                 (longdouble *)(uVar11 * 0x20 + lVar10),(longdouble *)(lVar10 + lVar9),args_3);
      if (local_64 < 0) {
        uVar12 = 0;
      }
      else {
        lVar9 = -1;
        lVar10 = 0x10;
        lVar14 = in_ST0;
        lVar3 = in_ST1;
        lVar4 = in_ST2;
        lVar5 = in_ST3;
        lVar6 = lVar15;
        do {
          lVar15 = lVar16;
          in_ST3 = lVar6;
          in_ST2 = lVar5;
          in_ST1 = lVar4;
          in_ST0 = lVar3;
          iVar1 = *(int *)(*(long *)(this + 0x60) + lVar10);
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar1].column);
          pbVar2 = *(bit_array **)(this + 0x50);
          *(longdouble *)&pbVar2[it[iVar1].value].super_bit_array_impl =
               local_60 + *(longdouble *)&pbVar2[it[iVar1].value].super_bit_array_impl;
          lVar16 = lVar15;
          solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
          ::local_compute_reduced_cost<baryonyx::bit_array>
                    ((longdouble *)this,
                     (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                      *)(ulong)(uint)it[iVar1].column,variable,pbVar2);
          if ((longdouble)0 <= lVar14) {
            lVar8 = (long)it[iVar1].value * 0x10;
            *(longdouble *)(*(long *)(this + 0x50) + lVar8) =
                 local_60 + (*(longdouble *)(*(long *)(this + 0x50) + lVar8) - lVar14);
          }
          lVar9 = lVar9 + 1;
          lVar10 = lVar10 + 0x20;
          lVar14 = in_ST0;
          lVar3 = in_ST1;
          lVar4 = in_ST2;
          lVar5 = in_ST3;
          lVar6 = lVar15;
        } while (lVar9 < local_64);
        uVar12 = (int)lVar9 + 1;
      }
      if (uVar12 != local_68) {
        uVar11 = (ulong)uVar12;
        uVar13 = uVar11 << 5 | 0x10;
        do {
          iVar1 = *(int *)(*(long *)(this + 0x60) + uVar13);
          bit_array_impl::unset(&x->super_bit_array_impl,it[iVar1].column);
          pbVar2 = *(bit_array **)(this + 0x50);
          *(longdouble *)&pbVar2[it[iVar1].value].super_bit_array_impl =
               *(longdouble *)&pbVar2[it[iVar1].value].super_bit_array_impl - local_60;
          lVar14 = lVar16;
          solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
          ::local_compute_reduced_cost<baryonyx::bit_array>
                    ((longdouble *)this,
                     (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                      *)(ulong)(uint)it[iVar1].column,variable,pbVar2);
          if (in_ST0 <= (longdouble)0) {
            lVar10 = (long)it[iVar1].value * 0x10;
            *(longdouble *)(*(long *)(this + 0x50) + lVar10) =
                 (*(longdouble *)(*(long *)(this + 0x50) + lVar10) + in_ST0) - local_60;
          }
          uVar11 = uVar11 + 1;
          uVar13 = uVar13 + 0x20;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = lVar15;
          lVar15 = lVar16;
          lVar16 = lVar14;
        } while (uVar11 != local_68);
      }
    }
    else {
      *args_3 = lVar15 * (longdouble)1.5 + local_3c;
      fmt_01._M_str = "    selected: {}/{} ({})/2 = pi {}\n";
      fmt_01._M_len = 0x23;
      lVar15 = in_ST3;
      lVar16 = in_ST3;
      debug_logger<true>::log<int,int,long_double,long_double>
                ((debug_logger<true> *)this,fmt_01,&local_64,(int *)&local_68,
                 (longdouble *)(lVar10 + uVar11 * 0x20),args_3);
      if (local_68 != 0) {
        lVar10 = 0x10;
        uVar11 = 0;
        do {
          iVar1 = *(int *)(*(long *)(this + 0x60) + lVar10);
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar1].column);
          pbVar2 = *(bit_array **)(this + 0x50);
          *(longdouble *)&pbVar2[it[iVar1].value].super_bit_array_impl =
               local_60 + *(longdouble *)&pbVar2[it[iVar1].value].super_bit_array_impl;
          lVar14 = lVar16;
          solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
          ::local_compute_reduced_cost<baryonyx::bit_array>
                    ((longdouble *)this,
                     (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                      *)(ulong)(uint)it[iVar1].column,variable,pbVar2);
          if ((longdouble)0 <= in_ST0) {
            lVar9 = (long)it[iVar1].value * 0x10;
            *(longdouble *)(*(long *)(this + 0x50) + lVar9) =
                 local_60 + (*(longdouble *)(*(long *)(this + 0x50) + lVar9) - in_ST0);
          }
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x20;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = lVar15;
          lVar15 = lVar16;
          lVar16 = lVar14;
        } while (uVar11 != local_68);
      }
    }
  }
  bVar7 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                      *)this,local_54,x);
  if (!bVar7) {
    local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>();
  }
  return (bool)((byte)((byte)((unkuint10)local_3c >> 0x48) ^
                      (byte)((ushort)*(undefined2 *)(*(long *)(this + 0x78) + 8 + local_50) >> 8))
               >> 7);
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }